

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<long>::TPZVec(TPZVec<long> *this,TPZVec<long> *rval)

{
  ulong uVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  uVar1 = rval->fNElements;
  this->fNElements = uVar1;
  lVar4 = rval->fNAlloc;
  if (lVar4 == 0) {
    plVar3 = (long *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3);
    this->fStore = plVar3;
    if (0 < this->fNElements) {
      plVar2 = rval->fStore;
      lVar4 = 1;
      if (1 < this->fNElements) {
        lVar4 = this->fNElements;
      }
      lVar5 = 0;
      do {
        plVar3[lVar5] = plVar2[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  else {
    this->fStore = rval->fStore;
    this->fNAlloc = lVar4;
    rval->fStore = (long *)0x0;
    rval->fNAlloc = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}